

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginFverb.cpp
# Opt level: O0

void __thiscall
PluginFverb::runSegmented(PluginFverb *this,float **inputs,float **outputs,uint32_t frames)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  uint local_a0;
  uint32_t ch_6;
  float dry_1;
  uint32_t i_3;
  uint32_t ch_5;
  uint32_t i_2;
  float dry;
  uint32_t ch_4;
  float wet_1;
  uint32_t i_1;
  uint32_t ch_3;
  uint32_t i;
  float wet;
  uint32_t ch_2;
  uint32_t ch_1;
  float *offsetOutputs [2];
  float *offsetInputs [2];
  uint local_40;
  uint32_t bs;
  uint32_t index;
  uint32_t ch;
  float *inputKeep [2];
  uint32_t frames_local;
  float **outputs_local;
  float **inputs_local;
  PluginFverb *this_local;
  
  inputKeep[1]._4_4_ = frames;
  for (bs = 0; bs < 2; bs = bs + 1) {
    pfVar1 = std::vector<float,_std::allocator<float>_>::data(this->fInputKeep + bs);
    *(float **)(&index + (ulong)bs * 2) = pfVar1;
    std::copy_n<float_const*,unsigned_int,float*>
              (inputs[bs],inputKeep[1]._4_4_,*(float **)(&index + (ulong)bs * 2));
  }
  for (local_40 = 0; local_40 < inputKeep[1]._4_4_; local_40 = offsetInputs[1]._4_4_ + local_40) {
    offsetInputs[1]._4_4_ = inputKeep[1]._4_4_ - local_40;
    if (0x100 < offsetInputs[1]._4_4_) {
      offsetInputs[1]._4_4_ = 0x100;
    }
    for (wet = 0.0; (uint)wet < 2; wet = (float)((int)wet + 1)) {
      offsetOutputs[(ulong)(uint)wet + 1] = inputs[(uint)wet] + local_40;
    }
    for (i = 0; i < 2; i = i + 1) {
      *(float **)(&ch_2 + (ulong)i * 2) = outputs[i] + local_40;
    }
    if ((this->fVintage & 1U) == 0) {
      runAtNormalRate(this,offsetOutputs + 1,(float **)&ch_2,offsetInputs[1]._4_4_);
    }
    else {
      runDownsampled(this,offsetOutputs + 1,(float **)&ch_2,offsetInputs[1]._4_4_);
    }
  }
  fVar2 = LinearSmoother::getCurrentValue(&this->fWet);
  fVar3 = LinearSmoother::getTarget(&this->fWet);
  if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
    for (ch_4 = 0; ch_4 < inputKeep[1]._4_4_; ch_4 = ch_4 + 1) {
      fVar2 = LinearSmoother::next(&this->fWet);
      for (i_2 = 0; i_2 < 2; i_2 = i_2 + 1) {
        outputs[i_2][ch_4] = fVar2 * outputs[i_2][ch_4];
      }
    }
  }
  else {
    fVar2 = LinearSmoother::getCurrentValue(&this->fWet);
    for (i_1 = 0; i_1 < inputKeep[1]._4_4_; i_1 = i_1 + 1) {
      for (wet_1 = 0.0; (uint)wet_1 < 2; wet_1 = (float)((int)wet_1 + 1)) {
        outputs[(uint)wet_1][i_1] = fVar2 * outputs[(uint)wet_1][i_1];
      }
    }
  }
  fVar2 = LinearSmoother::getCurrentValue(&this->fDry);
  fVar3 = LinearSmoother::getTarget(&this->fDry);
  if ((fVar2 != fVar3) || (NAN(fVar2) || NAN(fVar3))) {
    for (ch_6 = 0; ch_6 < inputKeep[1]._4_4_; ch_6 = ch_6 + 1) {
      fVar2 = LinearSmoother::next(&this->fDry);
      for (local_a0 = 0; local_a0 < 2; local_a0 = local_a0 + 1) {
        outputs[local_a0][ch_6] =
             fVar2 * *(float *)(*(long *)(&index + (ulong)local_a0 * 2) + (ulong)ch_6 * 4) +
             outputs[local_a0][ch_6];
      }
    }
  }
  else {
    fVar2 = LinearSmoother::getCurrentValue(&this->fDry);
    for (i_3 = 0; i_3 < inputKeep[1]._4_4_; i_3 = i_3 + 1) {
      for (dry_1 = 0.0; (uint)dry_1 < 2; dry_1 = (float)((int)dry_1 + 1)) {
        outputs[(uint)dry_1][i_3] =
             fVar2 * *(float *)(*(long *)(&index + (ulong)(uint)dry_1 * 2) + (ulong)i_3 * 4) +
             outputs[(uint)dry_1][i_3];
      }
    }
  }
  return;
}

Assistant:

void PluginFverb::runSegmented(const float **inputs, float **outputs, uint32_t frames)
{
    float *inputKeep[kNumChannels];
    for (uint32_t ch = 0; ch < kNumChannels; ++ch) {
        inputKeep[ch] = fInputKeep[ch].data();
        std::copy_n(inputs[ch], frames, inputKeep[ch]);
    }

    uint32_t index = 0;
    while (index < frames) {
        uint32_t bs = frames - index;
        if (bs > kMaxResampledBlock)
            bs = kMaxResampledBlock;

        const float *offsetInputs[kNumChannels];
        float *offsetOutputs[kNumChannels];
        for (uint32_t ch = 0; ch < kNumChannels; ++ch)
            offsetInputs[ch] = inputs[ch] + index;
        for (uint32_t ch = 0; ch < kNumChannels; ++ch)
            offsetOutputs[ch] = outputs[ch] + index;

        if (!fVintage)
            runAtNormalRate(offsetInputs, offsetOutputs, bs);
        else
            runDownsampled(offsetInputs, offsetOutputs, bs);

        index += bs;
    }

    ///
    if (fWet.getCurrentValue() == fWet.getTarget()) {
        float wet = fWet.getCurrentValue();
        for (uint32_t i = 0; i < frames; ++i) {
            for (uint32_t ch = 0; ch < kNumChannels; ++ch)
                outputs[ch][i] *= wet;
        }
    }
    else {
        for (uint32_t i = 0; i < frames; ++i) {
            float wet = fWet.next();
            for (uint32_t ch = 0; ch < kNumChannels; ++ch)
                outputs[ch][i] *= wet;
        }
    }

    ///
    if (fDry.getCurrentValue() == fDry.getTarget()) {
        float dry = fDry.getCurrentValue();
        for (uint32_t i = 0; i < frames; ++i) {
            for (uint32_t ch = 0; ch < kNumChannels; ++ch)
                outputs[ch][i] += dry * inputKeep[ch][i];
        }
    }
    else {
        for (uint32_t i = 0; i < frames; ++i) {
            float dry = fDry.next();
            for (uint32_t ch = 0; ch < kNumChannels; ++ch)
                outputs[ch][i] += dry * inputKeep[ch][i];
        }
    }
}